

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,Av<(moira::Instr)132,_(moira::Mode)2,_1> *av)

{
  if ((this->style->syntax & ~MOIRA_MIT) != GNU) {
    operator<<(this,"; (1+)");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(const Av<I, M, S> &av)
{
    if (style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) { return *this; }

    switch (I) {

        case Instr::BKPT:
        case Instr::MOVES:
        case Instr::MOVEFCCR:
        case Instr::RTD:

            *this << "; (1+)";
            break;

        case Instr::CMPI:

            *this << (isPrgMode(M) ? "; (1+)" : "");
            break;

        case Instr::CALLM:
        case Instr::RTM:

            *this << "; (2)";
            break;

        case Instr::cpGEN:
        case Instr::cpRESTORE:
        case Instr::cpSAVE:
        case Instr::cpScc:
        case Instr::cpTRAPcc:

            *this << "; (2-3)";
            break;

        case Instr::BFCHG:
        case Instr::BFCLR:
        case Instr::BFEXTS:
        case Instr::BFEXTU:
        case Instr::BFFFO:
        case Instr::BFINS:
        case Instr::BFSET:
        case Instr::BFTST:
        case Instr::CAS:
        case Instr::CAS2:
        case Instr::CHK2:
        case Instr::CMP2:
        case Instr::DIVL:
        case Instr::EXTB:
        case Instr::MULL:
        case Instr::PACK:
        case Instr::TRAPCC:
        case Instr::TRAPCS:
        case Instr::TRAPEQ:
        case Instr::TRAPGE:
        case Instr::TRAPGT:
        case Instr::TRAPHI:
        case Instr::TRAPLE:
        case Instr::TRAPLS:
        case Instr::TRAPLT:
        case Instr::TRAPMI:
        case Instr::TRAPNE:
        case Instr::TRAPPL:
        case Instr::TRAPVC:
        case Instr::TRAPVS:
        case Instr::TRAPF:
        case Instr::TRAPT:
        case Instr::UNPK:

            *this << "; (2+)";
            break;

        case Instr::CHK:
        case Instr::LINK:
        case Instr::BRA:
        case Instr::BHI:
        case Instr::BLS:
        case Instr::BCC:
        case Instr::BCS:
        case Instr::BNE:
        case Instr::BEQ:
        case Instr::BVC:
        case Instr::BVS:
        case Instr::BPL:
        case Instr::BMI:
        case Instr::BGE:
        case Instr::BLT:
        case Instr::BGT:
        case Instr::BLE:
        case Instr::BSR:

            *this << (S == Long ? "; (2+)" : "");
            break;

        case Instr::TST:
            *this << (M == Mode(1) || M >= Mode(9) ? "; (2+)" : "");
            break;

        case Instr::CINV:
        case Instr::CPUSH:
        case Instr::MOVE16:

            *this << "; (4)";
            break;

        case Instr::MOVEC:

            switch (av.ext1 & 0x0FFF) {

                case 0x000:
                case 0x001:
                case 0x800:
                case 0x801: *this << "; (1+)"; break;
                case 0x002:
                case 0x803:
                case 0x804: *this << "; (2+)"; break;
                case 0x802: *this << "; (2,3)"; break;
                case 0x003:
                case 0x004:
                case 0x005:
                case 0x006:
                case 0x007:
                case 0x805:
                case 0x806:
                case 0x807: *this << "; (4+)"; break;

                default:    *this << "; (?)";
            }

        default:
            break;
    }
    return *this;
}